

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  ImWchar c;
  ushort uVar4;
  
  uVar4 = *ranges;
  if (uVar4 != 0) {
    lVar3 = *(long *)(this + 8);
    do {
      uVar2 = ranges[1];
      for (; uVar4 <= uVar2; uVar4 = uVar4 + 1) {
        puVar1 = (uint *)(lVar3 + (ulong)(uVar4 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
      }
      uVar4 = ranges[2];
      ranges = ranges + 2;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}